

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

bool __thiscall
slang::IntervalMap<unsigned_long,_std::monostate,_0U>::iterator::erase
          (iterator *this,allocator_type *alloc,bool shouldRecomputeBounds)

{
  Path *this_00;
  uint32_t level;
  IntervalMap<unsigned_long,_std::monostate,_0U> *this_01;
  pointer pEVar1;
  size_type sVar2;
  NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U> *this_02;
  uint32_t uVar3;
  
  this_01 = (this->super_const_iterator).map;
  pEVar1 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  this_00 = &(this->super_const_iterator).path;
  sVar2 = (this->super_const_iterator).path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  uVar3 = pEVar1[sVar2 - 1].offset;
  level = this_01->height;
  if (level == 0) {
    IntervalMapDetails::
    NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>::erase
              ((NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U> *)
               this_01,uVar3,uVar3 + 1,this_01->rootSize);
    uVar3 = this_01->rootSize - 1;
    this_01->rootSize = uVar3;
    ((this_00->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size =
         uVar3;
  }
  else {
    this_02 = (NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U> *)
              pEVar1[sVar2 - 1].node;
    if (pEVar1[sVar2 - 1].size == 1) {
      this_02->first[0].left = (unsigned_long)alloc->freeList;
      alloc->freeList = (FreeNode *)this_02;
      eraseNode(this,level,alloc);
      return true;
    }
    IntervalMapDetails::
    NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>::erase
              (this_02,uVar3,uVar3 + 1,pEVar1[sVar2 - 1].size);
    IntervalMapDetails::Path::setSize
              (this_00,this_01->height,
               (this->super_const_iterator).path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
               [(this->super_const_iterator).path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].size - 1);
    if (shouldRecomputeBounds) {
      recomputeBounds(this,this_01->height);
    }
  }
  return false;
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::erase(allocator_type& alloc,
                                                   bool shouldRecomputeBounds) {
    auto& map = *this->map;
    auto& path = this->path;
    SLANG_ASSERT(this->valid());

    uint32_t offset = path.leafOffset();
    if (this->isFlat()) {
        map.rootLeaf.erase(offset, offset + 1, map.rootSize);
        path.setSize(0, --map.rootSize);
        return false;
    }

    // Nodes are not allowed to become empty, so erase the node itself
    // if that were to be the case.
    auto& node = path.template leaf<Leaf>();
    if (path.leafSize() == 1) {
        alloc.destroy(&node);
        eraseNode(map.height, alloc);
        return true;
    }

    // Otherwise just erase the current entry.
    node.erase(offset, offset + 1, path.leafSize());
    path.setSize(map.height, path.leafSize() - 1);

    if (shouldRecomputeBounds)
        recomputeBounds(map.height);

    return false;
}